

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::FreeSelf
          (Inner *this,ArenaAllocator *allocator)

{
  int local_1c;
  int i;
  ArenaAllocator *allocator_local;
  Inner *this_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    if (this->children[local_1c] != (Node *)0x0) {
      (**this->children[local_1c]->_vptr_Node)(this->children[local_1c],allocator);
      this->children[local_1c] = (Node *)0x0;
    }
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharMap<char16_t,int,(UnifiedRegex::CharMapScheme)1>::Inner>
            (allocator,this);
  return;
}

Assistant:

void FreeSelf(ArenaAllocator* allocator) override
            {
                for (int i = 0; i < branchingPerLevel; i++)
                {
                    if (children[i] != 0)
                    {
                        children[i]->FreeSelf(allocator);
#if DBG
                        children[i] = 0;
#endif
                    }
                }
                Adelete(allocator, this);
            }